

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O2

int xmllintShellDu(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr tree,xmlNodePtr node2)

{
  uint uVar1;
  char *in_RAX;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  int local_44;
  
  if (arg == (char *)0x0) {
LAB_0010b579:
    return (int)in_RAX;
  }
  local_44 = 0;
  pcVar2 = arg;
LAB_0010b428:
  do {
    iVar3 = 0;
    if (0 < local_44) {
      iVar3 = local_44;
    }
LAB_0010b43a:
    do {
      in_RAX = pcVar2;
      if (in_RAX == (char *)0x0) goto LAB_0010b579;
      uVar1 = *(uint *)(in_RAX + 8);
      if ((uVar1 == 0xd) || (uVar1 == 9)) {
        fwrite("/\n",2,1,(FILE *)ctxt->output);
LAB_0010b4c7:
        uVar1 = *(uint *)(in_RAX + 8);
      }
      else {
        iVar4 = iVar3;
        if (uVar1 == 1) {
          while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
            fwrite("  ",2,1,(FILE *)ctxt->output);
          }
          if ((*(long *)(in_RAX + 0x48) != 0) && (*(long *)(*(long *)(in_RAX + 0x48) + 0x18) != 0))
          {
            fprintf((FILE *)ctxt->output,"%s:");
          }
          fprintf((FILE *)ctxt->output,"%s\n",*(undefined8 *)(in_RAX + 0x10));
          goto LAB_0010b4c7;
        }
      }
      if ((uVar1 | 4) == 0xd) {
        pcVar2 = *(char **)(in_RAX + 0x18);
        goto LAB_0010b43a;
      }
      if (uVar1 != 5 && *(char **)(in_RAX + 0x18) != (char *)0x0) {
        local_44 = local_44 + 1;
        pcVar2 = *(char **)(in_RAX + 0x18);
        goto LAB_0010b428;
      }
      pcVar2 = (char *)0x0;
    } while ((in_RAX == arg) ||
            (pcVar2 = *(char **)(in_RAX + 0x30), *(char **)(in_RAX + 0x30) != (char *)0x0));
    do {
      if (in_RAX == arg) goto LAB_0010b564;
      pcVar2 = *(char **)(in_RAX + 0x28);
      pcVar5 = in_RAX;
      if (pcVar2 != (char *)0x0) {
        pcVar5 = pcVar2;
      }
      local_44 = local_44 - (uint)(pcVar2 != (char *)0x0);
      if (pcVar5 == arg) {
        in_RAX = (char *)0x0;
        goto LAB_0010b564;
      }
      in_RAX = *(char **)(pcVar5 + 0x30);
      if (in_RAX != (char *)0x0) goto LAB_0010b564;
      in_RAX = pcVar5;
    } while (*(long *)(pcVar5 + 0x28) != 0);
    in_RAX = (char *)0x0;
LAB_0010b564:
    pcVar2 = (char *)0x0;
    if (in_RAX != arg) {
      pcVar2 = in_RAX;
    }
  } while( true );
}

Assistant:

static int
xmllintShellDu(xmllintShellCtxtPtr ctxt,
           char *arg ATTRIBUTE_UNUSED, xmlNodePtr tree,
           xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr node;
    int indent = 0, i;

    if (!ctxt)
	return (-1);

    if (tree == NULL)
        return (-1);
    node = tree;
    while (node != NULL) {
        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            fprintf(ctxt->output, "/\n");
        } else if (node->type == XML_ELEMENT_NODE) {
            for (i = 0; i < indent; i++)
                fprintf(ctxt->output, "  ");
            if ((node->ns) && (node->ns->prefix))
                fprintf(ctxt->output, "%s:", node->ns->prefix);
            fprintf(ctxt->output, "%s\n", node->name);
        } else {
        }

        /*
         * Browse the full subtree, deep first
         */

        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            node = ((xmlDocPtr) node)->children;
        } else if ((node->children != NULL)
                   && (node->type != XML_ENTITY_REF_NODE)) {
            /* deep first */
            node = node->children;
            indent++;
        } else if ((node != tree) && (node->next != NULL)) {
            /* then siblings */
            node = node->next;
        } else if (node != tree) {
            /* go up to parents->next if needed */
            while (node != tree) {
                if (node->parent != NULL) {
                    node = node->parent;
                    indent--;
                }
                if ((node != tree) && (node->next != NULL)) {
                    node = node->next;
                    break;
                }
                if (node->parent == NULL) {
                    node = NULL;
                    break;
                }
                if (node == tree) {
                    node = NULL;
                    break;
                }
            }
            /* exit condition */
            if (node == tree)
                node = NULL;
        } else
            node = NULL;
    }
    return (0);
}